

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O0

void __thiscall wasm::extract(wasm *this,PassRunner *runner,Module *module,Name name)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pFVar4;
  pointer pFVar5;
  char *pcVar6;
  Name name_00;
  Name value;
  Name name_01;
  allocator<char> local_371;
  string local_370;
  undefined1 local_350 [8];
  PassRunner postRunner;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_210 [3];
  Fatal local_1f8;
  Name local_70;
  reference local_60;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range1;
  bool found;
  Module *module_local;
  PassRunner *runner_local;
  Name name_local;
  
  pcVar6 = name.super_IString.str._M_len;
  runner_local = (PassRunner *)module;
  name_local.super_IString.str._M_len = (size_t)pcVar6;
  poVar3 = std::operator<<((ostream *)&std::cerr,"extracting ");
  name_00.super_IString.str._M_str = pcVar6;
  name_00.super_IString.str._M_len = name_local.super_IString.str._M_len;
  poVar3 = operator<<((wasm *)poVar3,(ostream *)runner_local,name_00);
  std::operator<<(poVar3,"\n");
  bVar1 = false;
  __end1 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    *)&runner->passes);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                *)&runner->passes);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                *)&func);
    if (!bVar2) break;
    local_60 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end1);
    pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (local_60);
    bVar2 = IString::operator!=((IString *)pFVar4,(IString *)&runner_local);
    if (bVar2) {
      Name::Name(&local_70,"env");
      pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_60);
      Name::operator=(&(pFVar4->super_Importable).module,&local_70);
      pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_60);
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_60);
      Name::operator=(&(pFVar5->super_Importable).base,(Name *)pFVar4);
      pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_60);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::clear(&pFVar4->vars);
      pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_60);
      pFVar4->body = (Expression *)0x0;
    }
    else {
      bVar1 = true;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end1);
  }
  if (!bVar1) {
    Fatal::Fatal(&local_1f8);
    Fatal::operator<<(&local_1f8,(char (*) [40])"could not find the function to extract\n");
    Fatal::~Fatal(&local_1f8);
  }
  std::
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ::clear((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           *)runner);
  Module::updateMaps((Module *)runner);
  postRunner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)runner_local;
  value.super_IString.str._M_str = (char *)runner_local;
  value.super_IString.str._M_len = name_local.super_IString.str._M_len;
  name_01.super_IString.str._M_str = (char *)runner_local;
  name_01.super_IString.str._M_len = (size_t)local_210;
  Builder::makeExport(name_01,value,(ExternalKind)name_local.super_IString.str._M_len);
  Module::addExport((Module *)runner,local_210);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(local_210);
  PassRunner::PassRunner((PassRunner *)local_350,(PassRunner *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"remove-unused-module-elements",&local_371);
  PassRunner::add((PassRunner *)local_350,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  PassRunner::run((PassRunner *)local_350);
  PassRunner::~PassRunner((PassRunner *)local_350);
  return;
}

Assistant:

static void extract(PassRunner* runner, Module* module, Name name) {
  std::cerr << "extracting " << name << "\n";
  bool found = false;
  for (auto& func : module->functions) {
    if (func->name != name) {
      // Turn it into an import.
      func->module = "env";
      func->base = func->name;
      func->vars.clear();
      func->body = nullptr;
    } else {
      found = true;
    }
  }
  if (!found) {
    Fatal() << "could not find the function to extract\n";
  }

  // Leave just one export, for the thing we want.
  module->exports.clear();
  module->updateMaps();
  module->addExport(Builder::makeExport(name, name, ExternalKind::Function));

  // Remove unneeded things.
  PassRunner postRunner(runner);
  postRunner.add("remove-unused-module-elements");
  postRunner.run();
}